

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  float font_size;
  ImGuiWindow **ppIVar1;
  undefined8 in_RDX;
  undefined1 extraout_var [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar21 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar24 [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  ImRect IVar25;
  bool window_is_focused;
  ImRect title_r;
  ImRect thumb_r;
  ImGuiWindow *thumb_window;
  int i;
  float alpha_mul;
  ImVec2 off;
  ImVec2 scale;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  ImDrawCornerFlags in_stack_fffffffffffffe04;
  undefined8 in_stack_fffffffffffffe08;
  ImGuiWindow *in_stack_fffffffffffffe10;
  ImRect *in_stack_fffffffffffffe18;
  ImDrawList *in_stack_fffffffffffffe20;
  float wrap_width;
  ImVec2 *text_end;
  char *text_begin;
  ImU32 col;
  ImVec2 *pos;
  ImFont *font;
  ImDrawList *this;
  ImFont *cpu_fine_clip_rect;
  ImVec2 *in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe88;
  ImU32 in_stack_fffffffffffffe8c;
  ImVec2 *in_stack_fffffffffffffe90;
  ImVec2 *in_stack_fffffffffffffe98;
  ImDrawList *in_stack_fffffffffffffea0;
  ImVec2 local_110;
  undefined1 local_108 [32];
  ImVec2 local_e8;
  ImDrawVert *local_e0;
  undefined8 local_d8;
  ImVec2 local_d0;
  ImRect local_c8;
  ImDrawIdx *local_b8;
  ImVector<ImVec4> local_b0;
  ImVector<void_*> local_a0;
  ImVec2 local_90;
  ImRect local_88;
  ImVec2 local_78;
  ImVec2 local_70;
  undefined1 local_68 [24];
  int local_50;
  int local_4c;
  unsigned_short *local_48;
  ImVector<ImFontGlyph> local_40;
  ImFontGlyph *local_30;
  ImFontAtlas *local_28;
  ImGuiContext *local_20;
  undefined8 local_18;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  
  local_20 = GImGui;
  local_28 = (ImFontAtlas *)GImGui->CurrentWindow;
  local_18 = in_RDX;
  auVar5._0_8_ = ImRect::GetSize(in_stack_fffffffffffffdf8);
  auVar5._8_56_ = extraout_var;
  local_40.Data = (ImFontGlyph *)vmovlpd_avx(auVar5._0_16_);
  auVar2._0_8_ = operator/(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf247);
  auVar2._8_56_ = extraout_var_00;
  local_30 = (ImFontGlyph *)vmovlpd_avx(auVar2._0_16_);
  auVar3._0_8_ = ::operator*(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf279);
  auVar3._8_56_ = extraout_var_01;
  local_48 = (unsigned_short *)vmovlpd_avx(auVar3._0_16_);
  auVar4._0_8_ = ::operator-(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf297);
  auVar4._8_56_ = extraout_var_02;
  local_40._0_8_ = vmovlpd_avx(auVar4._0_16_);
  local_4c = 0x3f800000;
  GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
              SUB84(in_stack_fffffffffffffe10,0));
  auVar5 = ZEXT1264(ZEXT812(0));
  ImDrawList::AddRectFilled
            (in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->Min,
             (ImVec2 *)in_stack_fffffffffffffe10,(ImU32)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             (float)in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
  for (local_50 = 0; local_50 != (local_20->Windows).Size; local_50 = local_50 + 1) {
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    auVar24 = in_ZMM1._8_56_;
    auVar21 = auVar5._8_56_;
    local_68._16_8_ = *ppIVar1;
    if (((((ImGuiWindow *)local_68._16_8_)->WasActive & 1U) != 0) &&
       ((((ImGuiWindow *)local_68._16_8_)->Flags & 0x1000000U) == 0)) {
      IVar25 = ImGuiWindow::Rect((ImGuiWindow *)0x1cf3b4);
      auVar22._0_8_ = IVar25.Max;
      auVar22._8_56_ = auVar24;
      auVar6._0_8_ = IVar25.Min;
      auVar6._8_56_ = auVar21;
      local_68._0_8_ = vmovlpd_avx(auVar6._0_16_);
      in_stack_fffffffffffffe98 = (ImVec2 *)(local_68 + 8);
      local_68._8_8_ = vmovlpd_avx(auVar22._0_16_);
      IVar25 = ImGuiWindow::TitleBarRect(in_stack_fffffffffffffe10);
      auVar23._0_8_ = IVar25.Max;
      auVar23._8_56_ = auVar24;
      auVar7._0_8_ = IVar25.Min;
      auVar7._8_56_ = auVar21;
      local_78 = (ImVec2)vmovlpd_avx(auVar7._0_16_);
      local_70 = (ImVec2)vmovlpd_avx(auVar23._0_16_);
      auVar8._0_8_ = ::operator*(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf412);
      auVar8._8_56_ = extraout_var_03;
      local_a0._0_8_ = vmovlpd_avx(auVar8._0_16_);
      auVar9._0_8_ = ::operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf438);
      auVar9._8_56_ = extraout_var_04;
      local_a0.Data = (void **)vmovlpd_avx(auVar9._0_16_);
      auVar10._0_8_ = ImFloor(&in_stack_fffffffffffffdf8->Min);
      auVar10._8_56_ = extraout_var_05;
      local_90 = (ImVec2)vmovlpd_avx(auVar10._0_16_);
      auVar11._0_8_ = ::operator*(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf46c);
      auVar11._8_56_ = extraout_var_06;
      local_b8 = (ImDrawIdx *)vmovlpd_avx(auVar11._0_16_);
      auVar12._0_8_ = ::operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf48a);
      auVar12._8_56_ = extraout_var_07;
      local_b0._0_8_ = vmovlpd_avx(auVar12._0_16_);
      auVar13._0_8_ = ImFloor(&in_stack_fffffffffffffdf8->Min);
      auVar13._8_56_ = extraout_var_08;
      local_b0.Data = (ImVec4 *)vmovlpd_avx(auVar13._0_16_);
      ImRect::ImRect(&local_88,&local_90,(ImVec2 *)&local_b0.Data);
      local_68._0_4_ = local_88.Min.x;
      local_68._4_4_ = local_88.Min.y;
      local_68._8_4_ = local_88.Max.x;
      local_68._12_4_ = local_88.Max.y;
      auVar14._0_8_ = ::operator*(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf4ed);
      auVar14._8_56_ = extraout_var_09;
      local_e0 = (ImDrawVert *)vmovlpd_avx(auVar14._0_16_);
      auVar15._0_8_ = ::operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf50b);
      auVar15._8_56_ = extraout_var_10;
      local_d8 = vmovlpd_avx(auVar15._0_16_);
      auVar16._0_8_ = ImFloor(&in_stack_fffffffffffffdf8->Min);
      auVar16._8_56_ = extraout_var_11;
      local_d0 = (ImVec2)vmovlpd_avx(auVar16._0_16_);
      in_stack_fffffffffffffea0 = (ImDrawList *)local_108;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffea0,local_70.x,local_78.y);
      auVar17._0_8_ = ::operator*(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf566);
      auVar17._8_56_ = extraout_var_12;
      local_108._8_8_ = vmovlpd_avx(auVar17._0_16_);
      auVar18._0_8_ = ::operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf584);
      auVar18._8_56_ = extraout_var_13;
      local_108._16_8_ = vmovlpd_avx(auVar18._0_16_);
      auVar19._0_8_ = ImFloor(&in_stack_fffffffffffffdf8->Min);
      auVar19._8_56_ = extraout_var_14;
      local_108._24_8_ = vmovlpd_avx(auVar19._0_16_);
      ImVec2::ImVec2(&local_110,0.0,5.0);
      auVar20._0_8_ = ::operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x1cf5d9);
      auVar20._8_56_ = extraout_var_15;
      local_e8 = (ImVec2)vmovlpd_avx(auVar20._0_16_);
      ImRect::ImRect(&local_c8,&local_d0,&local_e8);
      local_78 = local_c8.Min;
      local_70 = local_c8.Max;
      ImRect::ClipWithFull((ImRect *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      ImRect::ClipWithFull((ImRect *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      in_stack_fffffffffffffe20 = *(ImDrawList **)&local_28->TexUvLines[0x24].z;
      wrap_width = (float)((ulong)local_68 >> 0x20);
      text_end = (ImVec2 *)(local_68 + 8);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                  SUB84(in_stack_fffffffffffffe10,0));
      ImDrawList::AddRectFilled
                (in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->Min,
                 (ImVec2 *)in_stack_fffffffffffffe10,
                 (ImU32)((ulong)in_stack_fffffffffffffe08 >> 0x20),(float)in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe04);
      text_begin = *(char **)&local_28->TexUvLines[0x24].z;
      col = (ImU32)((ulong)&local_78 >> 0x20);
      pos = &local_70;
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                  SUB84(in_stack_fffffffffffffe10,0));
      ImDrawList::AddRectFilled
                (in_stack_fffffffffffffe20,&in_stack_fffffffffffffe18->Min,
                 (ImVec2 *)in_stack_fffffffffffffe10,
                 (ImU32)((ulong)in_stack_fffffffffffffe08 >> 0x20),(float)in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe04);
      font_size = local_28->TexUvLines[0x24].w;
      font = (ImFont *)local_68;
      this = (ImDrawList *)(local_68 + 8);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                  SUB84(in_stack_fffffffffffffe10,0));
      ImDrawList::AddRect(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                          in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                          in_stack_fffffffffffffe88,
                          (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                          SUB84(in_stack_fffffffffffffe80,0));
      cpu_fine_clip_rect = local_20->Font;
      in_stack_fffffffffffffe80 = &local_78;
      in_stack_fffffffffffffe8c =
           GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                       SUB84(in_stack_fffffffffffffe10,0));
      in_stack_fffffffffffffe90 = (ImVec2 *)*(char **)local_68._16_8_;
      FindRenderedTextEnd(*(char **)local_68._16_8_,(char *)0x0);
      auVar5 = ZEXT464(0);
      in_ZMM1 = ZEXT1264(ZEXT812(0));
      in_stack_fffffffffffffdf8 = (ImRect *)0x0;
      ImDrawList::AddText(this,font,font_size,pos,col,text_begin,(char *)text_end,wrap_width,
                          (ImVec4 *)cpu_fine_clip_rect);
    }
  }
  GetColorU32(SUB84(local_18,4),(float)local_18);
  ImDrawList::AddRect(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                      in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                      (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                      SUB84(in_stack_fffffffffffffe80,0));
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}